

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O1

void highs_splay_unlink<presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
               (HighsInt unlinknode,HighsInt *root,anon_class_8_1_8991fb9c *get_left,
               anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  int root_00;
  pointer piVar1;
  HighsInt HVar2;
  undefined8 in_RAX;
  undefined8 local_38;
  
  local_38 = in_RAX;
  while( true ) {
    local_38 = CONCAT44(local_38._4_4_,
                        (get_key->this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[unlinknode]);
    HVar2 = highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                      ((int *)&local_38,*root,get_left,get_right,get_key);
    *root = HVar2;
    if (HVar2 == unlinknode) break;
    root = (get_right->this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + HVar2;
  }
  root_00 = (get_left->this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[unlinknode];
  if (root_00 == -1) {
    *root = (get_right->this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[unlinknode];
  }
  else {
    local_38 = CONCAT44((get_key->this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[unlinknode],(int)local_38);
    HVar2 = highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                      ((int *)((long)&local_38 + 4),root_00,get_left,get_right,get_key);
    *root = HVar2;
    piVar1 = (get_right->this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1[HVar2] = piVar1[unlinknode];
  }
  return;
}

Assistant:

void highs_splay_unlink(HighsInt unlinknode, HighsInt& root, GetLeft&& get_left,
                        GetRight&& get_right, GetKey&& get_key) {
  assert(root != -1);
  root = highs_splay(get_key(unlinknode), root, get_left, get_right, get_key);
  assert(get_key(root) == get_key(unlinknode));

  // in case keys can be equal it might happen that we did not splay the correct
  // node to the top since equal keys are put to the right subtree, we recurse
  // into that part of the tree
  if (root != unlinknode) {
    highs_splay_unlink(unlinknode, get_right(root), get_left, get_right,
                       get_key);
    return;
  }

  assert(root == unlinknode);

  if (get_left(unlinknode) == -1) {
    root = get_right(unlinknode);
  } else {
    root = highs_splay(get_key(unlinknode), get_left(unlinknode), get_left,
                       get_right, get_key);
    get_right(root) = get_right(unlinknode);
  }
}